

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

FuncInfo * __thiscall ByteCodeGenerator::GetEnclosingFuncInfo(ByteCodeGenerator *this)

{
  Type pFVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *ppFVar5;
  FuncInfo *second;
  FuncInfo *top;
  ByteCodeGenerator *this_local;
  
  top = (FuncInfo *)this;
  second = SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Pop(this->funcInfoStack);
  bVar3 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Empty
                    (&this->funcInfoStack->
                      super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x746,"(!this->funcInfoStack->Empty())","!this->funcInfoStack->Empty()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppFVar5 = SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Top(this->funcInfoStack);
  pFVar1 = *ppFVar5;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Push(this->funcInfoStack,&second);
  return pFVar1;
}

Assistant:

FuncInfo* ByteCodeGenerator::GetEnclosingFuncInfo()
{
    FuncInfo* top = this->funcInfoStack->Pop();

    Assert(!this->funcInfoStack->Empty());

    FuncInfo* second = this->funcInfoStack->Top();

    this->funcInfoStack->Push(top);

    return second;
}